

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O3

int32_t ucol_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  void *outData_00;
  void *inData_00;
  
  iVar3 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      *pErrorCode = U_ZERO_ERROR;
      iVar3 = anon_unknown.dwarf_390673::swapFormatVersion3(ds,inData,length,outData,pErrorCode);
      return iVar3;
    }
    bVar1 = *(byte *)((long)inData + 0xd);
    if ((((bVar1 == 0x43 && *(byte *)((long)inData + 0xc) == 0x55) &&
         (bVar1 = 0x43, *(char *)((long)inData + 0xe) == 'o')) &&
        (*(char *)((long)inData + 0xf) == 'l')) && ((byte)(*(byte *)((long)inData + 0x10) - 3) < 3))
    {
      inData_00 = (void *)((long)inData + (long)iVar2);
      iVar4 = 0;
      if (-1 < length) {
        iVar4 = iVar2;
      }
      outData_00 = (void *)((long)outData + (long)iVar2);
      if (*(byte *)((long)inData + 0x10) < 4) {
        iVar4 = anon_unknown.dwarf_390673::swapFormatVersion3
                          (ds,inData_00,length - iVar4,outData_00,pErrorCode);
      }
      else {
        iVar4 = anon_unknown.dwarf_390673::swapFormatVersion4
                          (ds,inData_00,length - iVar4,outData_00,pErrorCode);
      }
      iVar3 = 0;
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar3 = iVar4 + iVar2;
      }
    }
    else {
      udata_printError_63(ds,
                          "ucol_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as collation data\n"
                          ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar1,
                          (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                          (ulong)*(byte *)((long)inData + 0x10),
                          (ulong)*(byte *)((long)inData + 0x11));
      *pErrorCode = U_UNSUPPORTED_ERROR;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) { return 0; }

    /* udata_swapDataHeader checks the arguments */
    int32_t headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        // Try to swap the old format version which did not have a standard data header.
        *pErrorCode=U_ZERO_ERROR;
        return swapFormatVersion3(ds, inData, length, outData, pErrorCode);
    }

    /* check data format and format version */
    const UDataInfo &info=*(const UDataInfo *)((const char *)inData+4);
    if(!(
        info.dataFormat[0]==0x55 &&   // dataFormat="UCol"
        info.dataFormat[1]==0x43 &&
        info.dataFormat[2]==0x6f &&
        info.dataFormat[3]==0x6c &&
        (3<=info.formatVersion[0] && info.formatVersion[0]<=5)
    )) {
        udata_printError(ds, "ucol_swap(): data format %02x.%02x.%02x.%02x "
                         "(format version %02x.%02x) is not recognized as collation data\n",
                         info.dataFormat[0], info.dataFormat[1],
                         info.dataFormat[2], info.dataFormat[3],
                         info.formatVersion[0], info.formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inData=(const char *)inData+headerSize;
    if(length>=0) { length-=headerSize; }
    outData=(char *)outData+headerSize;
    int32_t collationSize;
    if(info.formatVersion[0]>=4) {
        collationSize=swapFormatVersion4(ds, inData, length, outData, *pErrorCode);
    } else {
        collationSize=swapFormatVersion3(ds, inData, length, outData, pErrorCode);
    }
    if(U_SUCCESS(*pErrorCode)) {
        return headerSize+collationSize;
    } else {
        return 0;
    }
}